

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinLaplace_picard_bnd.c
# Opt level: O0

void PrintFinalStats(void *kmem)

{
  undefined4 local_44;
  undefined8 uStack_40;
  int flag;
  long leniwB;
  long lenrwB;
  long nfeD;
  long nje;
  long nfe;
  long nni;
  void *kmem_local;
  
  nni = (long)kmem;
  local_44 = KINGetNumNonlinSolvIters(kmem,&nfe);
  check_flag(&local_44,"KINGetNumNonlinSolvIters",1);
  local_44 = KINGetNumFuncEvals(nni,&nje);
  check_flag(&local_44,"KINGetNumFuncEvals",1);
  local_44 = KINGetNumJacEvals(nni,&nfeD);
  check_flag(&local_44,"KINGetNumJacEvals",1);
  local_44 = KINGetNumLinFuncEvals(nni,&lenrwB);
  check_flag(&local_44,"KINGetNumLinFuncEvals",1);
  local_44 = KINGetLinWorkSpace(nni,&leniwB,&stack0xffffffffffffffc0);
  check_flag(&local_44,"KINGetLinWorkSpace",1);
  printf("\nFinal Statistics.. \n\n");
  printf("nni      = %6ld    nfe     = %6ld \n",nfe,nje);
  printf("nje      = %6ld    nfeB    = %6ld \n",nfeD,lenrwB);
  printf("\n");
  printf("lenrwB   = %6ld    leniwB  = %6ld \n",leniwB,uStack_40);
  return;
}

Assistant:

static void PrintFinalStats(void *kmem)
{
  long int nni, nfe, nje, nfeD;
  long int lenrwB, leniwB;
  int flag;

  /* Main solver statistics */

  flag = KINGetNumNonlinSolvIters(kmem, &nni);
  check_flag(&flag, "KINGetNumNonlinSolvIters", 1);
  flag = KINGetNumFuncEvals(kmem, &nfe);
  check_flag(&flag, "KINGetNumFuncEvals", 1);

  /* Band linear solver statistics */

  flag = KINGetNumJacEvals(kmem, &nje);
  check_flag(&flag, "KINGetNumJacEvals", 1);
  flag = KINGetNumLinFuncEvals(kmem, &nfeD);
  check_flag(&flag, "KINGetNumLinFuncEvals", 1);

  /* Band linear solver workspace size */

  flag = KINGetLinWorkSpace(kmem, &lenrwB, &leniwB);
  check_flag(&flag, "KINGetLinWorkSpace", 1);

  printf("\nFinal Statistics.. \n\n");
  printf("nni      = %6ld    nfe     = %6ld \n", nni, nfe);
  printf("nje      = %6ld    nfeB    = %6ld \n", nje, nfeD);
  printf("\n");
  printf("lenrwB   = %6ld    leniwB  = %6ld \n", lenrwB, leniwB);

}